

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RS232Port.h
# Opt level: O0

int ReadAllRS232Port(RS232PORT *pRS232Port,uint8 *readbuf,int readbuflen)

{
  int readbuflen_local;
  uint8 *readbuf_local;
  RS232PORT *pRS232Port_local;
  
  if (pRS232Port->DevType == 0) {
    pRS232Port_local._4_4_ = ReadAllComputerRS232Port(pRS232Port->hDev,readbuf,readbuflen);
  }
  else if (pRS232Port->DevType - 1U < 4) {
    pRS232Port_local._4_4_ = recvall(pRS232Port->s,(char *)readbuf,readbuflen);
  }
  else {
    pRS232Port_local._4_4_ = 1;
  }
  return pRS232Port_local._4_4_;
}

Assistant:

inline int ReadAllRS232Port(RS232PORT* pRS232Port, uint8* readbuf, int readbuflen)
{
	switch (pRS232Port->DevType)
	{
	case TCP_CLIENT_TYPE_RS232PORT:
	case TCP_SERVER_TYPE_RS232PORT:
	case UDP_CLIENT_TYPE_RS232PORT:
	case UDP_SERVER_TYPE_RS232PORT:
		return recvall(pRS232Port->s, (char*)readbuf, readbuflen);
	case LOCAL_TYPE_RS232PORT:
		return ReadAllComputerRS232Port(pRS232Port->hDev, readbuf, (int)readbuflen);
	default:
		PRINT_DEBUG_ERROR_RS232PORT(("ReadAllRS232Port error (%s) : %s"
			"(pRS232Port=%#x, readbuf=%#x, readbuflen=%d)\n", 
			strtime_m(), 
			"Invalid device type. ", 
			pRS232Port, readbuf, readbuflen));
		return EXIT_FAILURE;
	}
}